

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GenNativeStructUnPack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  FieldDef *pFVar1;
  string *psVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  pointer ppFVar7;
  ulong uVar8;
  IdlNamer *pIVar9;
  long *local_100;
  undefined8 local_f8;
  long local_f0;
  undefined8 uStack_e8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string *local_60;
  StructDef *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pIVar9 = &this->namer_;
  local_60 = code_ptr;
  local_58 = struct_def;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_50);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x36bdc9);
  local_80 = &local_70;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_70 = *plVar5;
    lStack_68 = plVar3[3];
  }
  else {
    local_70 = *plVar5;
    local_80 = (long *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_d0 = *puVar6;
    uStack_c8 = (undefined4)plVar3[3];
    uStack_c4 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar6;
    local_e0 = (ulong *)*plVar3;
  }
  local_d8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (*(pIVar9->super_Namer)._vptr_Namer[0x11])(&local_a0,pIVar9,local_58);
  uVar8 = 0xf;
  if (local_e0 != &local_d0) {
    uVar8 = local_d0;
  }
  if (uVar8 < (ulong)(local_98 + local_d8)) {
    uVar8 = 0xf;
    if (local_a0 != local_90) {
      uVar8 = local_90[0];
    }
    if (uVar8 < (ulong)(local_98 + local_d8)) goto LAB_00209f4a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0);
  }
  else {
LAB_00209f4a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0);
  }
  local_100 = &local_f0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_f0 = *plVar3;
    uStack_e8 = puVar4[3];
  }
  else {
    local_f0 = *plVar3;
    local_100 = (long *)*puVar4;
  }
  local_f8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_100);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_60,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  ppFVar7 = (local_58->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar7 !=
      (local_58->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pFVar1 = *ppFVar7;
      if ((pFVar1->value).type.base_type == BASE_TYPE_STRUCT) {
        (*(pIVar9->super_Namer)._vptr_Namer[0x12])(local_50,pIVar9,pFVar1);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x36bd02);
        local_80 = &local_70;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_70 = *plVar5;
          lStack_68 = plVar3[3];
        }
        else {
          local_70 = *plVar5;
          local_80 = (long *)*plVar3;
        }
        local_78 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
        puVar6 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar6) {
          local_d0 = *puVar6;
          uStack_c8 = (undefined4)plVar3[3];
          uStack_c4 = *(undefined4 *)((long)plVar3 + 0x1c);
          local_e0 = &local_d0;
        }
        else {
          local_d0 = *puVar6;
          local_e0 = (ulong *)*plVar3;
        }
        local_d8 = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        (*(pIVar9->super_Namer)._vptr_Namer[4])(&local_a0,pIVar9,pFVar1);
        uVar8 = 0xf;
        if (local_e0 != &local_d0) {
          uVar8 = local_d0;
        }
        if (uVar8 < (ulong)(local_98 + local_d8)) {
          uVar8 = 0xf;
          if (local_a0 != local_90) {
            uVar8 = local_90[0];
          }
          if (uVar8 < (ulong)(local_98 + local_d8)) goto LAB_0020a2e7;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0);
        }
        else {
LAB_0020a2e7:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0);
        }
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_f0 = *plVar3;
          uStack_e8 = puVar4[3];
          local_100 = &local_f0;
        }
        else {
          local_f0 = *plVar3;
          local_100 = (long *)*puVar4;
        }
        local_f8 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_100);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_b0 = *plVar5;
          lStack_a8 = plVar3[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar5;
          local_c0 = (long *)*plVar3;
        }
        local_b8 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_60,(ulong)local_c0);
      }
      else {
        (*(pIVar9->super_Namer)._vptr_Namer[0x12])(local_50,pIVar9,pFVar1);
        puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x36bd02)
        ;
        local_80 = &local_70;
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_70 = *plVar3;
          lStack_68 = puVar4[3];
        }
        else {
          local_70 = *plVar3;
          local_80 = (long *)*puVar4;
        }
        local_78 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        puVar6 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar6) {
          local_d0 = *puVar6;
          uStack_c8 = *(undefined4 *)(puVar4 + 3);
          uStack_c4 = *(undefined4 *)((long)puVar4 + 0x1c);
          local_e0 = &local_d0;
        }
        else {
          local_d0 = *puVar6;
          local_e0 = (ulong *)*puVar4;
        }
        local_d8 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        (*(pIVar9->super_Namer)._vptr_Namer[4])(&local_a0,pIVar9,pFVar1);
        uVar8 = 0xf;
        if (local_e0 != &local_d0) {
          uVar8 = local_d0;
        }
        if (uVar8 < (ulong)(local_98 + local_d8)) {
          uVar8 = 0xf;
          if (local_a0 != local_90) {
            uVar8 = local_90[0];
          }
          if (uVar8 < (ulong)(local_98 + local_d8)) goto LAB_0020a374;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0);
        }
        else {
LAB_0020a374:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0);
        }
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_f0 = *plVar3;
          uStack_e8 = puVar4[3];
          local_100 = &local_f0;
        }
        else {
          local_f0 = *plVar3;
          local_100 = (long *)*puVar4;
        }
        local_f8 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_100);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_b0 = *plVar5;
          lStack_a8 = plVar3[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar5;
          local_c0 = (long *)*plVar3;
        }
        local_b8 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_60,(ulong)local_c0);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0 + 1);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      ppFVar7 = ppFVar7 + 1;
    } while (ppFVar7 !=
             (local_58->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)local_60);
  (*(pIVar9->super_Namer)._vptr_Namer[0xf])(local_50,pIVar9,local_58);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x36bdc9);
  local_80 = &local_70;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_70 = *plVar5;
    lStack_68 = plVar3[3];
  }
  else {
    local_70 = *plVar5;
    local_80 = (long *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
  puVar6 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar6) {
    local_d0 = *puVar6;
    uStack_c8 = *(undefined4 *)(puVar4 + 3);
    uStack_c4 = *(undefined4 *)((long)puVar4 + 0x1c);
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar6;
    local_e0 = (ulong *)*puVar4;
  }
  local_d8 = puVar4[1];
  *puVar4 = puVar6;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  (*(pIVar9->super_Namer)._vptr_Namer[0x11])(&local_a0,pIVar9,local_58);
  uVar8 = 0xf;
  if (local_e0 != &local_d0) {
    uVar8 = local_d0;
  }
  if (uVar8 < (ulong)(local_98 + local_d8)) {
    uVar8 = 0xf;
    if (local_a0 != local_90) {
      uVar8 = local_90[0];
    }
    if ((ulong)(local_98 + local_d8) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0);
      goto LAB_0020a72e;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0);
LAB_0020a72e:
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_f0 = *plVar3;
    uStack_e8 = puVar4[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar3;
    local_100 = (long *)*puVar4;
  }
  local_f8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_100);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_60,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  std::__cxx11::string::append((char *)local_60);
  (*(pIVar9->super_Namer)._vptr_Namer[0x11])(&local_e0,pIVar9,local_58);
  puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x36bf18);
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_f0 = *plVar3;
    uStack_e8 = puVar4[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar3;
    local_100 = (long *)*puVar4;
  }
  local_f8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_100);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_b0 = *plVar5;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar5;
    local_c0 = (long *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_60,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  psVar2 = local_60;
  std::__cxx11::string::append((char *)local_60);
  std::__cxx11::string::append((char *)psVar2);
  std::__cxx11::string::append((char *)psVar2);
  return;
}

Assistant:

void GenNativeStructUnPack(const StructDef &struct_def,
                             std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += "func (rcv *" + namer_.Type(struct_def) + ") UnPackTo(t *" +
            NativeName(struct_def) + ") {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        code += "\tt." + namer_.Field(field) + " = rcv." +
                namer_.Method(field) + "(nil).UnPack()\n";
      } else {
        code += "\tt." + namer_.Field(field) + " = rcv." +
                namer_.Method(field) + "()\n";
      }
    }
    code += "}\n\n";

    code += "func (rcv *" + namer_.Type(struct_def) + ") UnPack() *" +
            NativeName(struct_def) + " {\n";
    code += "\tif rcv == nil {\n\t\treturn nil\n\t}\n";
    code += "\tt := &" + NativeName(struct_def) + "{}\n";
    code += "\trcv.UnPackTo(t)\n";
    code += "\treturn t\n";
    code += "}\n\n";
  }